

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtest.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  pthread_t *ppVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  char *__s;
  long lVar7;
  void *res;
  pthread_attr_t attr;
  void *local_80;
  ulong local_78;
  pthread_t *local_70;
  pthread_attr_t local_68;
  
  fork();
  iVar1 = pthread_attr_init(&local_68);
  if (iVar1 == 0) {
    iVar1 = pthread_attr_setstacksize(&local_68,0x10000000);
    if (iVar1 == 0) {
      uVar6 = argc - 1;
      ppVar2 = (pthread_t *)calloc((long)(int)uVar6,0x18);
      if (ppVar2 == (pthread_t *)0x0) {
        __s = "calloc";
      }
      else {
        uVar5 = 0;
        if (0 < (int)uVar6) {
          uVar5 = (ulong)uVar6;
        }
        uVar4 = 0;
        local_78 = (ulong)(uint)argc;
        local_70 = ppVar2;
        do {
          if (uVar5 == uVar4) {
            iVar1 = pthread_attr_destroy(&local_68);
            ppVar2 = local_70;
            if (iVar1 == 0) {
              if ((int)local_78 < 2) goto LAB_001047be;
              lVar7 = 0;
              while( true ) {
                iVar1 = pthread_join(*(pthread_t *)((long)ppVar2 + lVar7),&local_80);
                if (iVar1 != 0) break;
                printf("Joined with thread %d; returned value was %s\n",
                       (ulong)*(uint *)((long)ppVar2 + lVar7 + 8),local_80);
                free(local_80);
                lVar7 = lVar7 + 0x18;
                if ((ulong)uVar6 * 0x18 == lVar7) {
LAB_001047be:
                  free(ppVar2);
                  exit(0);
                }
              }
              piVar3 = __errno_location();
              *piVar3 = iVar1;
              __s = "pthread_join";
            }
            else {
              piVar3 = __errno_location();
              *piVar3 = iVar1;
              __s = "pthread_attr_destroy";
            }
            goto LAB_001046c7;
          }
          *(int *)(ppVar2 + 1) = (int)(uVar4 + 1);
          ppVar2[2] = (pthread_t)argv[(long)_optind + uVar4];
          iVar1 = pthread_create(ppVar2,&local_68,thread_start,ppVar2);
          ppVar2 = ppVar2 + 3;
          uVar4 = uVar4 + 1;
        } while (iVar1 == 0);
        piVar3 = __errno_location();
        *piVar3 = iVar1;
        __s = "pthread_create";
      }
    }
    else {
      piVar3 = __errno_location();
      *piVar3 = iVar1;
      __s = "pthread_attr_setstacksize";
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = iVar1;
    __s = "pthread_attr_init";
  }
LAB_001046c7:
  perror(__s);
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
    int s, tnum, opt, num_threads;
    struct thread_info *tinfo;
    pthread_attr_t attr;
    int stack_size;
    void *res;

    /* The "-s" option specifies a stack size for our threads */

    // Fix me, if stack_size != [0x10000000], always report below memory leak
    //leak memory [0x122c560, 304]back trace:
    //#1      0x7f8f69af5e55  /lib64/ld-linux-x86-64.so.2     _dl_allocate_tls
    //#2      0x7f8f696c9da1  /lib/x86_64-linux-gnu/libpthread.so.0   pthread_create
    //#3      0x4014dd        ./out/smtest    (nul)
    //#4      0x7f8f69018ec5  /lib/x86_64-linux-gnu/libc.so.6 __libc_start_main
    //#5      0x401129        ./out/smtest    (nul)
    stack_size = 0x10000000;
    num_threads = argc - 1;

    fork();

    /* Initialize thread creation attributes */

    s = pthread_attr_init(&attr);
    if (s != 0)
        handle_error_en(s, "pthread_attr_init");

    if (stack_size > 0) {
        s = pthread_attr_setstacksize(&attr, stack_size);
        if (s != 0)
            handle_error_en(s, "pthread_attr_setstacksize");
    }

    /* Allocate memory for pthread_create() arguments */

    tinfo = (struct thread_info*)calloc(num_threads, sizeof(struct thread_info));
    if (tinfo == NULL)
        handle_error("calloc");

    /* Create one thread for each command-line argument */

    for (tnum = 0; tnum < num_threads; tnum++) {
        tinfo[tnum].thread_num = tnum + 1;
        tinfo[tnum].argv_string = argv[optind + tnum];

        /* The pthread_create() call stores the thread ID into
           corresponding element of tinfo[] */

        s = pthread_create(&tinfo[tnum].thread_id, &attr,
                           &thread_start, &tinfo[tnum]);
        if (s != 0)
            handle_error_en(s, "pthread_create");
    }

    /* Destroy the thread attributes object, since it is no
       longer needed */

    s = pthread_attr_destroy(&attr);
    if (s != 0)
        handle_error_en(s, "pthread_attr_destroy");

    /* Now join with each thread, and display its returned value */

    for (tnum = 0; tnum < num_threads; tnum++) {
        s = pthread_join(tinfo[tnum].thread_id, &res);
        if (s != 0)
            handle_error_en(s, "pthread_join");

        printf("Joined with thread %d; returned value was %s\n",
                tinfo[tnum].thread_num, (char *) res);
        free(res);      /* Free memory allocated by thread */
    }

    free(tinfo);
    exit(EXIT_SUCCESS);
}